

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t read_magic_and_flags(exr_context_t ctxt,uint32_t *outflags,uint64_t *initpos)

{
  undefined8 *in_RDX;
  uint *in_RSI;
  long in_RDI;
  int64_t nread;
  uint64_t fileoff;
  exr_result_t rv;
  uint32_t flags;
  uint32_t magic_and_version [2];
  undefined8 local_40;
  undefined8 local_38;
  int local_30;
  uint local_2c;
  int local_28;
  uint local_24;
  undefined8 *local_20;
  uint *local_18;
  long local_10;
  int local_4;
  
  local_30 = 0x21;
  local_38 = 0;
  local_40 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = (**(code **)(in_RDI + 0x28))(in_RDI,&local_28,8,&local_38,&local_40,0);
  if (local_30 == 0) {
    *local_20 = 8;
    priv_to_native32(&local_28,2);
    if (local_28 == 0x1312f76) {
      local_2c = local_24;
      *(uint *)(local_10 + 0x224) = local_24;
      *(char *)(local_10 + 1) = (char)local_24;
      if (*(char *)(local_10 + 1) == '\x02') {
        local_2c = local_24 & 0xffffff00;
        if ((local_24 & 0xffffe100) == 0) {
          *local_18 = local_2c;
          local_4 = 0;
        }
        else {
          local_4 = (**(code **)(local_10 + 0x48))
                              (local_10,6,"File has an unsupported flags: magic 0x%08X flags 0x%08X"
                               ,0x1312f76,local_24);
        }
      }
      else {
        local_4 = (**(code **)(local_10 + 0x48))
                            (local_10,6,
                             "File is of an unsupported version: %d, magic 0x%08X flags 0x%08X",
                             *(undefined1 *)(local_10 + 1),0x1312f76,local_24);
      }
    }
    else {
      local_4 = (**(code **)(local_10 + 0x48))
                          (local_10,6,"File is not an OpenEXR file: magic 0x%08X (%d) flags 0x%08X",
                           local_28,local_28,local_24);
    }
  }
  else {
    (**(code **)(local_10 + 0x40))(local_10,10,"Unable to read magic and version flags");
    local_4 = local_30;
  }
  return local_4;
}

Assistant:

static exr_result_t
read_magic_and_flags (exr_context_t ctxt, uint32_t* outflags, uint64_t* initpos)
{
    uint32_t     magic_and_version[2];
    uint32_t     flags;
    exr_result_t rv      = EXR_ERR_UNKNOWN;
    uint64_t     fileoff = 0;
    int64_t      nread   = 0;

    rv = ctxt->do_read (
        ctxt,
        magic_and_version,
        sizeof (uint32_t) * 2,
        &fileoff,
        &nread,
        EXR_MUST_READ_ALL);
    if (rv != EXR_ERR_SUCCESS)
    {
        ctxt->report_error (
            ctxt, EXR_ERR_READ_IO, "Unable to read magic and version flags");
        return rv;
    }

    *initpos = sizeof (uint32_t) * 2;

    priv_to_native32 (magic_and_version, 2);
    if (magic_and_version[0] != 20000630)
    {
        rv = ctxt->print_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "File is not an OpenEXR file: magic 0x%08X (%d) flags 0x%08X",
            magic_and_version[0],
            (int) magic_and_version[0],
            magic_and_version[1]);
        return rv;
    }

    flags = magic_and_version[1];

    ctxt->orig_version_and_flags = flags;
    ctxt->version = flags & EXR_FILE_VERSION_MASK;
    if (ctxt->version != 2)
    {
        rv = ctxt->print_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "File is of an unsupported version: %d, magic 0x%08X flags 0x%08X",
            (int) ctxt->version,
            magic_and_version[0],
            magic_and_version[1]);
        return rv;
    }

    flags = flags & ~((uint32_t) EXR_FILE_VERSION_MASK);
    if ((flags & ~((uint32_t) EXR_VALID_FLAGS)) != 0)
    {
        rv = ctxt->print_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "File has an unsupported flags: magic 0x%08X flags 0x%08X",
            magic_and_version[0],
            magic_and_version[1]);
        return rv;
    }
    *outflags = flags;
    return EXR_ERR_SUCCESS;
}